

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout_json.c
# Opt level: O2

void ourWriteOutJSON(FILE *stream,writeoutvar *mappings,per_transfer *per,CURLcode per_result)

{
  int iVar1;
  char *in;
  
  fputs("{",(FILE *)stream);
  for (; mappings->name != (char *)0x0; mappings = mappings + 1) {
    if (mappings->writefunc !=
        (_func_int_FILE_ptr_writeoutvar_ptr_per_transfer_ptr_CURLcode__Bool *)0x0) {
      iVar1 = (*mappings->writefunc)(stream,mappings,per,per_result,true);
      if (iVar1 != 0) {
        fputs(",",(FILE *)stream);
      }
    }
  }
  curl_mfprintf(stream,"\"curl_version\":\"");
  in = (char *)curl_version();
  jsonWriteString(stream,in);
  curl_mfprintf(stream,"\"}");
  return;
}

Assistant:

void ourWriteOutJSON(FILE *stream, const struct writeoutvar mappings[],
                     struct per_transfer *per, CURLcode per_result)
{
  int i;

  fputs("{", stream);

  for(i = 0; mappings[i].name != NULL; i++) {
    if(mappings[i].writefunc &&
       mappings[i].writefunc(stream, &mappings[i], per, per_result, true))
      fputs(",", stream);
  }

  /* The variables are sorted in alphabetical order but as a special case
     curl_version (which is not actually a --write-out variable) is last. */
  fprintf(stream, "\"curl_version\":\"");
  jsonWriteString(stream, curl_version());
  fprintf(stream, "\"}");
}